

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

WindowQuantileState<duckdb::string_t> * __thiscall
duckdb::QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::GetOrCreateWindowState
          (QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *this)

{
  _Head_base<0UL,_duckdb::WindowQuantileState<duckdb::string_t>_*,_false> __p;
  pointer in_RAX;
  type pWVar1;
  _Head_base<0UL,_duckdb::WindowQuantileState<duckdb::string_t>_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  if ((this->window_state).
      super_unique_ptr<duckdb::WindowQuantileState<duckdb::string_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::string_t>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::WindowQuantileState<duckdb::string_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::string_t>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowQuantileState<duckdb::string_t>_*,_std::default_delete<duckdb::WindowQuantileState<duckdb::string_t>_>_>
      .super__Head_base<0UL,_duckdb::WindowQuantileState<duckdb::string_t>_*,_false>._M_head_impl ==
      (WindowQuantileState<duckdb::string_t> *)0x0) {
    make_uniq<duckdb::WindowQuantileState<duckdb::string_t>>();
    __p._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::WindowQuantileState<duckdb::string_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::string_t>_>_>
    ::reset((__uniq_ptr_impl<duckdb::WindowQuantileState<duckdb::string_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::string_t>_>_>
             *)&this->window_state,__p._M_head_impl);
    ::std::
    unique_ptr<duckdb::WindowQuantileState<duckdb::string_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::string_t>_>_>
    ::~unique_ptr((unique_ptr<duckdb::WindowQuantileState<duckdb::string_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::string_t>_>_>
                   *)&local_18);
  }
  pWVar1 = unique_ptr<duckdb::WindowQuantileState<duckdb::string_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::string_t>_>,_true>
           ::operator*(&this->window_state);
  return pWVar1;
}

Assistant:

WindowQuantileState<INPUT_TYPE> &GetOrCreateWindowState() {
		if (!window_state) {
			window_state = make_uniq<WindowQuantileState<INPUT_TYPE>>();
		}
		return *window_state;
	}